

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_order.cpp
# Opt level: O3

SourceResultType __thiscall
duckdb::PhysicalOrder::GetData
          (PhysicalOrder *this,ExecutionContext *context,DataChunk *chunk,OperatorSourceInput *input
          )

{
  default_delete<duckdb::PayloadScanner> *this_00;
  GlobalSourceState *pGVar1;
  _func_int **pp_Var2;
  GlobalSourceState *pGVar3;
  LocalSourceState *pLVar4;
  PayloadScanner *pPVar5;
  pointer pPVar6;
  pointer pRVar7;
  pointer pGVar8;
  PayloadScanner *this_01;
  bool bVar9;
  
  pGVar3 = input->global_state;
  pLVar4 = input->local_state;
  this_00 = (default_delete<duckdb::PayloadScanner> *)(pLVar4 + 2);
  if (pLVar4[2]._vptr_LocalSourceState != (_func_int **)0x0) {
    pPVar6 = unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>::
             operator->((unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>
                         *)this_00);
    pRVar7 = unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true>
             ::operator->(&pPVar6->scanner);
    if (pRVar7->total_count == pRVar7->total_scanned) {
      LOCK();
      pGVar1 = pGVar3 + 1;
      pp_Var2 = pGVar1->_vptr_GlobalSourceState;
      pGVar1->_vptr_GlobalSourceState = (_func_int **)((long)pGVar1->_vptr_GlobalSourceState + 1);
      UNLOCK();
      pLVar4[1]._vptr_LocalSourceState = pp_Var2;
      pPVar5 = (PayloadScanner *)pLVar4[2]._vptr_LocalSourceState;
      pLVar4[2]._vptr_LocalSourceState = (_func_int **)0x0;
      if (pPVar5 != (PayloadScanner *)0x0) {
        ::std::default_delete<duckdb::PayloadScanner>::operator()(this_00,pPVar5);
      }
    }
  }
  bVar9 = true;
  if (pLVar4[1]._vptr_LocalSourceState < *(_func_int ***)&pGVar3[1].super_StateWithBlockableTasks) {
    if (*(long *)this_00 == 0) {
      pGVar8 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
               ::operator->(&(this->super_PhysicalOperator).sink_state);
      this_01 = (PayloadScanner *)operator_new(0x18);
      PayloadScanner::PayloadScanner
                (this_01,(GlobalSortState *)&pGVar8[1].super_StateWithBlockableTasks,
                 (idx_t)pLVar4[1]._vptr_LocalSourceState,true);
      pPVar5 = *(PayloadScanner **)this_00;
      *(PayloadScanner **)this_00 = this_01;
      if (pPVar5 != (PayloadScanner *)0x0) {
        ::std::default_delete<duckdb::PayloadScanner>::operator()(this_00,pPVar5);
      }
    }
    pPVar6 = unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>::
             operator->((unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>
                         *)this_00);
    PayloadScanner::Scan(pPVar6,chunk);
    bVar9 = chunk->count == 0;
  }
  return bVar9;
}

Assistant:

SourceResultType PhysicalOrder::GetData(ExecutionContext &context, DataChunk &chunk, OperatorSourceInput &input) const {
	auto &gstate = input.global_state.Cast<PhysicalOrderGlobalSourceState>();
	auto &lstate = input.local_state.Cast<PhysicalOrderLocalSourceState>();

	if (lstate.scanner && lstate.scanner->Remaining() == 0) {
		lstate.batch_index = gstate.next_batch_index++;
		lstate.scanner = nullptr;
	}

	if (lstate.batch_index >= gstate.total_batches) {
		return SourceResultType::FINISHED;
	}

	if (!lstate.scanner) {
		auto &sink = this->sink_state->Cast<OrderGlobalSinkState>();
		auto &global_sort_state = sink.global_sort_state;
		lstate.scanner = make_uniq<PayloadScanner>(global_sort_state, lstate.batch_index, true);
	}

	lstate.scanner->Scan(chunk);

	return chunk.size() == 0 ? SourceResultType::FINISHED : SourceResultType::HAVE_MORE_OUTPUT;
}